

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O3

ImGuiTableSettings * ImGui::TableSettingsFindByID(ImGuiID id)

{
  char *pcVar1;
  ImGuiTableSettings *p;
  ImChunkStream<ImGuiTableSettings> *this;
  
  pcVar1 = (GImGui->SettingsTables).Buf.Data;
  if (pcVar1 != (char *)0x0) {
    this = &GImGui->SettingsTables;
    p = (ImGuiTableSettings *)(pcVar1 + 4);
    do {
      if (p->ID == id) {
        return p;
      }
      p = ImChunkStream<ImGuiTableSettings>::next_chunk(this,p);
    } while (p != (ImGuiTableSettings *)0x0);
  }
  return (ImGuiTableSettings *)0x0;
}

Assistant:

ImGuiTableSettings* ImGui::TableSettingsFindByID(ImGuiID id)
{
    // FIXME-OPT: Might want to store a lookup map for this?
    ImGuiContext& g = *GImGui;
    for (ImGuiTableSettings* settings = g.SettingsTables.begin(); settings != NULL; settings = g.SettingsTables.next_chunk(settings))
        if (settings->ID == id)
            return settings;
    return NULL;
}